

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

Instr * __thiscall FlowGraph::RemoveInstr(FlowGraph *this,Instr *instr,GlobOpt *globOpt)

{
  IRKind IVar1;
  OpCode OVar2;
  Func *this_00;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  GlobOptBlockData *this_01;
  StackSym *pSVar6;
  ByteCodeUsesInstr *this_02;
  LabelInstr *pLVar7;
  undefined4 *puVar8;
  LabelInstr *pLVar9;
  
  pLVar9 = (LabelInstr *)instr->m_prev;
  if (globOpt == (GlobOpt *)0x0) {
    IR::Instr::Remove(instr);
  }
  else {
    IVar1 = instr->m_kind;
    if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
      *(byte *)&instr[1].m_func = *(byte *)&instr[1].m_func & 0xfe;
      return instr;
    }
    OVar2 = instr->m_opcode;
    if (IVar1 == InstrKindByteCodeUses && OVar2 == ByteCodeUses) {
      return instr;
    }
    if ((OVar2 == LdElemI_A) && (bVar4 = IR::Instr::DoStackArgsOpt(instr), bVar4)) {
      this_01 = GlobOpt::CurrentBlockData(globOpt);
      BVar5 = GlobOptBlockData::IsArgumentsOpnd(this_01,instr->m_src1);
      if ((BVar5 != 0) && (pSVar6 = Func::GetScopeObjSym(instr->m_func), pSVar6 != (StackSym *)0x0))
      {
        this_02 = IR::ByteCodeUsesInstr::New(instr);
        pSVar6 = Func::GetScopeObjSym(instr->m_func);
        IR::ByteCodeUsesInstr::SetNonOpndSymbol(this_02,(pSVar6->super_Sym).m_id);
        IR::Instr::InsertAfter(instr,&this_02->super_Instr);
      }
    }
    pLVar7 = (LabelInstr *)GlobOpt::ConvertToByteCodeUses(globOpt,instr);
    if (pLVar7 == (LabelInstr *)0x0) {
      return &pLVar9->super_Instr;
    }
    *(undefined8 *)
     &(pLVar7->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount = 0;
    pLVar9 = pLVar7;
    if (OVar2 != Yield) {
      return &pLVar7->super_Instr;
    }
    do {
      pLVar9 = (LabelInstr *)(pLVar9->super_Instr).m_next;
    } while ((pLVar9->super_Instr).m_opcode != GeneratorBailInLabel);
    this_00 = this->func;
    IVar1 = (pLVar9->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar4) goto LAB_0041fa65;
      *puVar8 = 0;
    }
    Func::RemoveDeadYieldOffsetResumeLabel(this_00,pLVar9);
    IVar1 = (pLVar9->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar4) {
LAB_0041fa65:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    pLVar9->field_0x78 = pLVar9->field_0x78 & 0xfb;
    pLVar9 = pLVar7;
  }
  return &pLVar9->super_Instr;
}

Assistant:

IR::Instr *
FlowGraph::RemoveInstr(IR::Instr *instr, GlobOpt * globOpt)
{
    IR::Instr *instrPrev = instr->m_prev;
    if (globOpt)
    {
        // Removing block during glob opt.  Need to maintain the graph so that
        // bailout will record the byte code use in case the dead code is exposed
        // by dyno-pogo optimization (where bailout need the byte code uses from
        // the dead blocks where it may not be dead after bailing out)
        if (instr->IsLabelInstr())
        {
            instr->AsLabelInstr()->m_isLoopTop = false;
            return instr;
        }
        else if (instr->IsByteCodeUsesInstr())
        {
            return instr;
        }

        /*
        *   Scope object has to be implicitly live whenever Heap Arguments object is live.
        *       - When we restore HeapArguments object in the bail out path, it expects the scope object also to be restored - if one was created.
        */
        Js::OpCode opcode = instr->m_opcode;
        if (opcode == Js::OpCode::LdElemI_A && instr->DoStackArgsOpt() &&
            globOpt->CurrentBlockData()->IsArgumentsOpnd(instr->GetSrc1()) && instr->m_func->GetScopeObjSym())
        {
            IR::ByteCodeUsesInstr * byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(instr);
            byteCodeUsesInstr->SetNonOpndSymbol(instr->m_func->GetScopeObjSym()->m_id);
            instr->InsertAfter(byteCodeUsesInstr);
        }

        IR::ByteCodeUsesInstr * newByteCodeUseInstr = globOpt->ConvertToByteCodeUses(instr);
        if (newByteCodeUseInstr != nullptr)
        {
            // We don't care about property used in these instruction
            // It is only necessary for field copy prop so that we will keep the implicit call
            // up to the copy prop location.
            newByteCodeUseInstr->propertySymUse = nullptr;

            if (opcode == Js::OpCode::Yield)
            {
                IR::Instr *instrLabel = newByteCodeUseInstr->m_next;
                while (instrLabel->m_opcode != Js::OpCode::GeneratorBailInLabel)
                {
                    instrLabel = instrLabel->m_next;
                }
                func->RemoveDeadYieldOffsetResumeLabel(instrLabel->AsLabelInstr());
                instrLabel->AsLabelInstr()->m_hasNonBranchRef = false;
            }

            // Save the last instruction to update the block with
            return newByteCodeUseInstr;
        }
        else
        {
            return instrPrev;
        }
    }
    else
    {
        instr->Remove();
        return instrPrev;
    }
}